

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O1

Var Js::CrossSite::DefaultThunk(RecyclableObject *callable,CallInfo callInfo,...)

{
  ScriptContext *this;
  FunctionInfo *this_00;
  FunctionProxy *this_01;
  bool bVar1;
  BOOL BVar2;
  JavascriptFunction *obj;
  undefined4 *puVar3;
  JavascriptMethod p_Var4;
  ThreadContext *this_02;
  HostScriptContext *requestHostScriptContext;
  FunctionBody *pFVar5;
  ScriptFunction *this_03;
  ProxyEntryPointInfo *pPVar6;
  Var pvVar7;
  code *pcVar8;
  int in_stack_00000010;
  Arguments local_40;
  
  obj = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(callable);
  if (((obj->super_DynamicObject).super_RecyclableObject.type.ptr)->typeId != TypeIds_Function) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x19e,"(function->GetTypeId() == TypeIds_Function)",
                                "function->GetTypeId() == TypeIds_Function");
    if (!bVar1) goto LAB_00761b03;
    *puVar3 = 0;
  }
  p_Var4 = RecyclableObject::GetEntryPoint((RecyclableObject *)obj);
  if (p_Var4 != DefaultThunk) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x19f,"(function->GetEntryPoint() == CrossSite::DefaultThunk)",
                                "function->GetEntryPoint() == CrossSite::DefaultThunk");
    if (!bVar1) goto LAB_00761b03;
    *puVar3 = 0;
  }
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x1a0,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar1) {
LAB_00761b03:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar3 = 0;
  }
  this = (((((obj->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
  BVar2 = RecyclableObject::IsExternal((RecyclableObject *)obj);
  this_02 = ThreadContext::GetContextForCurrentThread();
  requestHostScriptContext = ThreadContext::GetPreviousHostScriptContext(this_02);
  ScriptContext::VerifyAliveWithHostContext(this,(uint)(BVar2 == 0),requestHostScriptContext);
  this_00 = (obj->functionInfo).ptr;
  this_01 = (this_00->functionBodyImpl).ptr;
  if (this_01 == (FunctionProxy *)0x0) {
    pcVar8 = FunctionInfo::GetOriginalEntryPoint(this_00);
  }
  else {
    bVar1 = FunctionProxy::IsFunctionBody(this_01);
    if (bVar1) {
      pFVar5 = FunctionInfo::GetFunctionBody(this_00);
      if (((pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 4) != 0) {
        pcVar8 = AsmJsExternalEntryPoint;
        goto LAB_00761add;
      }
    }
    this_03 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(obj);
    pPVar6 = ScriptFunction::GetEntryPointInfo(this_03);
    pcVar8 = pPVar6->jsMethod;
  }
LAB_00761add:
  local_40.Values = (Type)&stack0x00000018;
  local_40.Info = callInfo;
  pvVar7 = CommonThunk((RecyclableObject *)obj,pcVar8,&local_40);
  return pvVar7;
}

Assistant:

Var CrossSite::DefaultThunk(RecyclableObject* callable, CallInfo callInfo, ...)
    {
        JavascriptFunction* function = VarTo<JavascriptFunction>(callable);
        Assert(function->GetTypeId() == TypeIds_Function);
        Assert(function->GetEntryPoint() == CrossSite::DefaultThunk);
        RUNTIME_ARGUMENTS(args, callInfo);

        // It is not safe to access the function body if the script context is not alive.
        function->GetScriptContext()->VerifyAliveWithHostContext(!function->IsExternal(),
            ThreadContext::GetContextForCurrentThread()->GetPreviousHostScriptContext());

        JavascriptMethod entryPoint;
        FunctionInfo *funcInfo = function->GetFunctionInfo();

        TTD_XSITE_LOG(callable->GetScriptContext(), "DefaultOrProfileThunk", callable);

        if (funcInfo->HasBody())
        {
#ifdef ASMJS_PLAT
            if (funcInfo->GetFunctionProxy()->IsFunctionBody() &&
                funcInfo->GetFunctionBody()->GetIsAsmJsFunction())
            {
                entryPoint = Js::AsmJsExternalEntryPoint;
            }
            else
#endif
            {
                entryPoint = VarTo<ScriptFunction>(function)->GetEntryPointInfo()->jsMethod;
            }
        }
        else
        {
            entryPoint = funcInfo->GetOriginalEntryPoint();
        }
        return CommonThunk(function, entryPoint, args);
    }